

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_buffered_policy_e zbuff;
  ZSTD_frameParameters fParams;
  ZSTD_buffered_policy_e in_stack_000000d4;
  U64 in_stack_000000d8;
  ZSTD_CCtx *in_stack_000000e0;
  ZSTD_CCtx *in_stack_000000e8;
  undefined1 in_stack_00000104 [12];
  
  sVar1 = ZSTD_copyCCtx_internal
                    (in_stack_000000e8,in_stack_000000e0,(ZSTD_frameParameters)in_stack_00000104,
                     in_stack_000000d8,in_stack_000000d4);
  return sVar1;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = srcCCtx->bufferedPolicy;
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}